

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

void absl::anon_unknown_0::EncodeResult<float>
               (CalculatedFloat *calculated,bool negative,from_chars_result *result,float *value)

{
  float fVar1;
  float fVar2;
  float local_3c;
  float local_2c;
  float *value_local;
  from_chars_result *result_local;
  bool negative_local;
  CalculatedFloat *calculated_local;
  
  if (calculated->exponent == 99999) {
    result->ec = result_out_of_range;
    fVar1 = std::numeric_limits<float>::max();
    fVar2 = std::numeric_limits<float>::max();
    local_2c = -fVar1;
    if (!negative) {
      local_2c = fVar2;
    }
    *value = local_2c;
  }
  else if ((calculated->mantissa == 0) || (calculated->exponent == -99999)) {
    result->ec = result_out_of_range;
    local_3c = -0.0;
    if (!negative) {
      local_3c = 0.0;
    }
    *value = local_3c;
  }
  else {
    fVar1 = FloatTraits<float>::Make((mantissa_t)calculated->mantissa,calculated->exponent,negative)
    ;
    *value = fVar1;
  }
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::from_chars_result* absl_nonnull result,
                  FloatType* absl_nonnull value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0f : 0.0f;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}